

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

uint8_t iff_getop(uint8_t *list,int pos)

{
  byte bVar1;
  
  if (-1 < pos) {
    bVar1 = (char)pos * '\x02' & 6;
    return (uint8_t)((3 << bVar1 & (uint)list[(uint)pos >> 2]) >> bVar1);
  }
  __assert_fail("pos >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                ,0x4e7,"uint8_t iff_getop(uint8_t *, int)");
}

Assistant:

uint8_t
iff_getop(uint8_t *list, int pos)
{
    uint8_t *item;
    uint8_t mask = 3, result;

    assert(pos >= 0);

    item = &list[pos / 4];
    result = (*item) & (mask << 2 * (pos % 4));
    return result >> 2 * (pos % 4);
}